

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  Tables *pTVar1;
  pointer pbVar2;
  size_t sVar3;
  size_t __n;
  _func_int **pp_Var4;
  size_t size;
  DescriptorPool *pDVar5;
  pointer pcVar6;
  StringPiece name;
  int iVar7;
  const_iterator cVar8;
  char *pcVar9;
  Type *pTVar10;
  FileDescriptor *pFVar11;
  undefined8 *puVar12;
  long lVar13;
  size_type *psVar14;
  long lVar15;
  bool bVar16;
  FileDescriptorProto existing_proto;
  string local_148;
  string local_128;
  FileDescriptorProto local_108;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pTVar1 = this->tables_;
  local_108.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)(this->filename_)._M_dataplus._M_p;
  local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (this->filename_)._M_string_length;
  if (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_,
               "string length exceeds max size");
  }
  cVar8 = std::
          _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pTVar1->files_by_name_)._M_h,(key_type *)&local_108);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pFVar11 = (FileDescriptor *)0x0;
  }
  else {
    pFVar11 = *(FileDescriptor **)
               ((long)cVar8.
                      super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                      ._M_cur + 0x18);
  }
  if (pFVar11 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&local_108,(Arena *)0x0,false);
    FileDescriptor::CopyTo(pFVar11,&local_108);
    if ((pFVar11[0x3a] == (FileDescriptor)0x2) && (((proto->_has_bits_).has_bits_[0] & 4) != 0)) {
      pcVar9 = FileDescriptor::SyntaxName(SYNTAX_PROTO2);
      local_108._has_bits_.has_bits_[0]._0_1_ = (byte)local_108._has_bits_.has_bits_[0] | 4;
      puVar12 = (undefined8 *)
                (local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                0xfffffffffffffffc);
      if ((local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        puVar12 = (undefined8 *)*puVar12;
      }
      internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                (&local_108.syntax_,pcVar9,puVar12);
    }
    MessageLite::SerializeAsString_abi_cxx11_(&local_148,(MessageLite *)&local_108);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)proto);
    if (local_148._M_string_length == local_128._M_string_length) {
      if (local_148._M_string_length == 0) {
        bVar16 = true;
      }
      else {
        iVar7 = bcmp(local_148._M_dataplus._M_p,local_128._M_dataplus._M_p,
                     local_148._M_string_length);
        bVar16 = iVar7 == 0;
      }
    }
    else {
      bVar16 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_108);
    if (bVar16) {
      return pFVar11;
    }
  }
  pbVar2 = (this->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 5;
    puVar12 = (undefined8 *)((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    sVar3 = puVar12[1];
    psVar14 = &pbVar2->_M_string_length;
    lVar15 = 0;
    do {
      __n = *psVar14;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar7 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar14 + -1))->_M_dataplus)._M_p,(void *)*puVar12,__n), iVar7 == 0)))) {
        AddRecursiveImportError(this,proto,(int)lVar15);
        return (FileDescriptor *)0x0;
      }
      lVar15 = lVar15 + 1;
      psVar14 = psVar14 + 4;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar15);
  }
  if ((this->pool_->lazily_build_dependencies_ == false) &&
     (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->tables_->pending_files_,
                (value_type *)((ulong)(proto->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &proto->dependency_;
      iVar7 = 0;
      do {
        pTVar1 = this->tables_;
        pTVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,iVar7);
        pp_Var4 = (_func_int **)(pTVar10->_M_dataplus)._M_p;
        size = pTVar10->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        local_108.super_Message.super_MessageLite._vptr_MessageLite = pp_Var4;
        local_108.super_Message.super_MessageLite._internal_metadata_.ptr_ = size;
        cVar8 = std::
                _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pTVar1->files_by_name_)._M_h,(key_type *)&local_108);
        if ((cVar8.
             super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(long *)((long)cVar8.
                            super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x18) == 0)) {
          pDVar5 = this->pool_->underlay_;
          if (pDVar5 != (DescriptorPool *)0x0) {
            pTVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_00->super_RepeatedPtrFieldBase,iVar7);
            pFVar11 = DescriptorPool::FindFileByName(pDVar5,pTVar10);
            if (pFVar11 != (FileDescriptor *)0x0) goto LAB_00355edb;
          }
          pDVar5 = this->pool_;
          pTVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,iVar7);
          name.ptr_ = (pTVar10->_M_dataplus)._M_p;
          name.length_ = pTVar10->_M_string_length;
          if ((long)pTVar10->_M_string_length < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (pTVar10->_M_string_length,"string length exceeds max size");
          }
          DescriptorPool::TryFindFileInFallbackDatabase(pDVar5,name);
        }
LAB_00355edb:
        iVar7 = iVar7 + 1;
      } while (iVar7 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pbVar2 = (this->tables_->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->tables_->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
    pcVar6 = pbVar2[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &pbVar2[-1].field_2) {
      operator_delete(pcVar6);
    }
  }
  DescriptorPool::Tables::AddCheckpoint(this->tables_);
  pFVar11 = BuildFileImpl(this,proto);
  FileDescriptorTables::FinalizeTables(this->file_tables_);
  if (pFVar11 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    pFVar11[0x39] = (FileDescriptor)0x1;
  }
  return pFVar11;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (size_t i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}